

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O2

bool __thiscall
deqp::gls::BuiltinPrecisionTests::InputLess<tcu::Vector<int,_3>_>::operator()
          (InputLess<tcu::Vector<int,_3>_> *this,Vector<int,_3> *vec1,Vector<int,_3> *vec2)

{
  ulong uVar1;
  ulong uVar2;
  
  uVar2 = 0;
  do {
    uVar1 = uVar2;
    uVar2 = uVar1;
    if (uVar1 == 3) goto LAB_014a483a;
    if (vec1->m_data[uVar1] < vec2->m_data[uVar1]) {
      uVar2 = 1;
      goto LAB_014a483a;
    }
    uVar2 = uVar1 + 1;
  } while (vec1->m_data[uVar1] <= vec2->m_data[uVar1]);
  uVar2 = 0;
LAB_014a483a:
  return (bool)(uVar1 < 3 & (byte)uVar2);
}

Assistant:

bool operator() (const Vector<T, Size>& vec1, const Vector<T, Size>& vec2) const
	{
		for (int ndx = 0; ndx < Size; ++ndx)
		{
			if (inputLess(vec1[ndx], vec2[ndx]))
				return true;
			if (inputLess(vec2[ndx], vec1[ndx]))
				return false;
		}

		return false;
	}